

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O2

void __thiscall ValidateDamageBin::ReadDamageBinDictFile(ValidateDamageBin *this,bool convertToBin)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  do {
    pcVar3 = fgets((char *)this,0x1000,_stdin);
    if (pcVar3 == (char *)0x0) {
      return;
    }
    iVar2 = ScanDeprecatedFormat(this);
    if (iVar2 == 5) {
      if (this->newFormat_ == true) {
        uVar1 = (this->super_Validate).lineno_;
        pcVar3 = "ERROR: Deprecated format used in line %d:\n%s\n";
LAB_00101717:
        fprintf(_stderr,pcVar3,(ulong)uVar1,this);
        Validate::PrintErrorMessage(&this->super_Validate);
      }
    }
    else {
      iVar2 = ScanNewFormat(this);
      if (iVar2 != 4) {
        uVar1 = (this->super_Validate).lineno_;
        pcVar3 = "ERROR: Invalid data in line %d:\n%s\n";
        goto LAB_00101717;
      }
      if (this->newFormat_ == false) {
        fprintf(_stderr,"ERROR: Missing interval type column in line %d:\n%s\n",
                (ulong)(uint)(this->super_Validate).lineno_,this);
        Validate::PrintErrorMessage(&this->super_Validate);
      }
      (this->dbd_).interval_type = 0;
    }
    CheckContiguousBinIndices(this);
    CheckInterpolationDamageValuesWithinRange(this);
    StoreLine(this);
    if (convertToBin) {
      ConvertToBin(this);
    }
  } while( true );
}

Assistant:

void ValidateDamageBin::ReadDamageBinDictFile(const bool convertToBin) {
/* After reading in a line from the csv file and checking for data integrity,
 * this method calls other methods to check for contiguous bin indices and
 * whether the interpolation value lies within the defined range. */

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanDeprecatedFormat() == 5) {

      if (newFormat_) {

        fprintf(stderr, "ERROR: Deprecated format used in line %d:\n%s\n",
                lineno_, line_);
        PrintErrorMessage();

      }

    } else if (ScanNewFormat() == 4) {

      if (!newFormat_) {

        fprintf(stderr, "ERROR: Missing interval type column in line %d:\n%s\n",
                lineno_, line_);
        PrintErrorMessage();

      }

      dbd_.interval_type = 0;

    } else {

      fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
      PrintErrorMessage();

    }

    CheckContiguousBinIndices();
    CheckInterpolationDamageValuesWithinRange();
    StoreLine();
    if (convertToBin) ConvertToBin();

  }

}